

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::handleNonExpr
          (RunContext *this,AssertionInfo *info,OfType resultType,AssertionReaction *reaction)

{
  Flags *this_00;
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_t sVar4;
  size_type sVar5;
  undefined1 auStack_108 [8];
  AssertionResult assertionResult;
  AssertionResultData data;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar1 = (info->macroName).m_start;
  sVar2 = (info->macroName).m_size;
  pcVar3 = (info->lineInfo).file;
  sVar4 = (info->lineInfo).line;
  sVar5 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar5;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar3;
  (this->m_lastAssertionInfo).lineInfo.line = sVar4;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar1;
  (this->m_lastAssertionInfo).macroName.m_size = sVar2;
  assertionResult.m_resultData._80_8_ = &data.message._M_string_length;
  data.message._M_dataplus._M_p = (pointer)0x0;
  data.message._M_string_length._0_1_ = 0;
  data.message.field_2._8_8_ = &data.reconstructedExpression._M_string_length;
  data.reconstructedExpression._M_dataplus._M_p = (pointer)0x0;
  data.reconstructedExpression._M_string_length._0_1_ = 0;
  data.reconstructedExpression.field_2._8_8_ = 0;
  data.lazyExpression.m_transientExpression._0_1_ = 0;
  assertionResult.m_info.capturedExpression.m_size = *(size_type *)&info->resultDisposition;
  this_00 = &assertionResult.m_info.resultDisposition;
  auStack_108 = (undefined1  [8])(info->macroName).m_start;
  assertionResult.m_info.macroName.m_start = (char *)(info->macroName).m_size;
  assertionResult.m_info.macroName.m_size = (size_type)(info->lineInfo).file;
  assertionResult.m_info.lineInfo.file = (char *)(info->lineInfo).line;
  assertionResult.m_info.lineInfo.line = (size_t)(info->capturedExpression).m_start;
  assertionResult.m_info.capturedExpression.m_start = (char *)(info->capturedExpression).m_size;
  data.lazyExpression._8_4_ = resultType;
  AssertionResultData::AssertionResultData
            ((AssertionResultData *)this_00,
             (AssertionResultData *)&assertionResult.m_resultData.resultType);
  assertionEnded(this,(AssertionResult *)auStack_108);
  if (((assertionResult.m_resultData.lazyExpression.m_isNegated & 0x10U) != 0) &&
     ((assertionResult.m_info.capturedExpression.m_size & 8) == 0)) {
    populateReaction(this,reaction);
  }
  AssertionResultData::~AssertionResultData((AssertionResultData *)this_00);
  AssertionResultData::~AssertionResultData
            ((AssertionResultData *)&assertionResult.m_resultData.resultType);
  return;
}

Assistant:

void RunContext::handleNonExpr(
        AssertionInfo const& info,
        ResultWas::OfType resultType,
        AssertionReaction& reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data(resultType, LazyExpression(false));
        AssertionResult assertionResult{ info, data };
        assertionEnded(assertionResult);

        if (!assertionResult.isOk())
            populateReaction(reaction);
    }